

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaLiteTest_Parsing_Test::TestBody
          (Proto3ArenaLiteTest_Parsing_Test *this)

{
  void *pvVar1;
  TestAllTypes *m;
  Arena *pAVar2;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view data;
  TestAllTypes original;
  Arena arena;
  string local_408;
  undefined1 local_3e8 [288];
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  undefined1 local_2b0 [24];
  RepeatedPtrFieldBase local_298;
  RepeatedPtrFieldBase local_280 [2];
  RepeatedField<int> local_250;
  RepeatedField<int> local_238 [4];
  RepeatedPtrFieldBase local_1f0;
  ArenaStringPtr local_1d8;
  ArenaStringPtr local_1d0 [34];
  ArenaStringPtr local_c0 [2];
  ThreadSafeArena local_b0;
  
  proto3_arena_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_3e8,(Arena *)0x0);
  local_1d0[10].tagged_ptr_.ptr_._0_4_ = 100;
  local_3e8._16_4_ = local_3e8._16_4_ | 0x801;
  pAVar2 = (Arena *)local_3e8._8_8_;
  if ((local_3e8._8_8_ & 1) != 0) {
    pAVar2 = *(Arena **)(local_3e8._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "asdf";
  value._M_len = 4;
  protobuf::internal::ArenaStringPtr::Set(&local_1d8,value,pAVar2);
  local_3e8._16_4_ = local_3e8._16_4_ | 2;
  pAVar2 = (Arena *)local_3e8._8_8_;
  if ((local_3e8._8_8_ & 1) != 0) {
    pAVar2 = *(Arena **)(local_3e8._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "jkl;";
  value_00._M_len = 4;
  protobuf::internal::ArenaStringPtr::Set(local_1d0,value_00,pAVar2);
  local_3e8._16_4_ = local_3e8._16_4_ | 0x10;
  if (local_1d0[3].tagged_ptr_.ptr_ == (void *)0x0) {
    pAVar2 = (Arena *)local_3e8._8_8_;
    if ((local_3e8._8_8_ & 1) != 0) {
      pAVar2 = *(Arena **)(local_3e8._8_8_ & 0xfffffffffffffffe);
    }
    local_1d0[3].tagged_ptr_.ptr_ =
         (TaggedStringPtr)
         Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(pAVar2);
  }
  (((anon_union_12_1_493b367e_for_TestAllTypes_NestedMessage_3 *)
   ((long)local_1d0[3].tagged_ptr_.ptr_ + 0x10))->_impl_).bb_ = 0x2a;
  *(byte *)((long)local_1d0[3].tagged_ptr_.ptr_ + 0x10) =
       *(byte *)((long)local_1d0[3].tagged_ptr_.ptr_ + 0x10) | 1;
  local_3e8._16_4_ = local_3e8._16_4_ | 0x20;
  if (local_1d0[4].tagged_ptr_.ptr_ == (void *)0x0) {
    pAVar2 = (Arena *)local_3e8._8_8_;
    if ((local_3e8._8_8_ & 1) != 0) {
      pAVar2 = *(Arena **)(local_3e8._8_8_ & 0xfffffffffffffffe);
    }
    local_1d0[4].tagged_ptr_.ptr_ =
         (TaggedStringPtr)Arena::DefaultConstruct<proto3_arena_unittest::ForeignMessage>(pAVar2);
  }
  (((anon_union_12_1_493b367e_for_ForeignMessage_3 *)((long)local_1d0[4].tagged_ptr_.ptr_ + 0x10))->
  _impl_).c_ = 0x2b;
  *(byte *)((long)local_1d0[4].tagged_ptr_.ptr_ + 0x10) =
       *(byte *)((long)local_1d0[4].tagged_ptr_.ptr_ + 0x10) | 1;
  local_1d0._148_8_ = 0x600000003;
  local_3e8._16_4_ = local_3e8._16_4_ | 0x1800100;
  if (local_1d0[7].tagged_ptr_.ptr_ == (void *)0x0) {
    pAVar2 = (Arena *)local_3e8._8_8_;
    if ((local_3e8._8_8_ & 1) != 0) {
      pAVar2 = *(Arena **)(local_3e8._8_8_ & 0xfffffffffffffffe);
    }
    local_1d0[7].tagged_ptr_.ptr_ =
         (TaggedStringPtr)
         Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(pAVar2);
  }
  (((anon_union_12_1_493b367e_for_TestAllTypes_NestedMessage_3 *)
   ((long)local_1d0[7].tagged_ptr_.ptr_ + 0x10))->_impl_).bb_ = 0x2d;
  *(byte *)((long)local_1d0[7].tagged_ptr_.ptr_ + 0x10) =
       *(byte *)((long)local_1d0[7].tagged_ptr_.ptr_ + 0x10) | 1;
  RepeatedField<int>::Add((RepeatedField<int> *)(local_3e8 + 0x20),100);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[5]>(&local_2c8,(char (*) [5])"asdf");
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[5],google::protobuf::internal::BytesTag>
            (local_2b0,"jkl;");
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&local_298,
                      Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x2e;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (local_280,Arena::DefaultConstruct<proto3_arena_unittest::ForeignMessage>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x2f;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  RepeatedField<int>::Add(&local_250,3);
  RepeatedField<int>::Add(local_238,6);
  pvVar1 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&local_1f0,
                      Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>);
  *(undefined4 *)((long)pvVar1 + 0x18) = 0x31;
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  if (local_c0[1].tagged_ptr_.ptr_._0_4_ != 0x6f) {
    proto3_arena_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_3e8);
    local_c0[1].tagged_ptr_.ptr_._0_4_ = 0x6f;
  }
  local_c0[0].tagged_ptr_.ptr_._0_4_ = 1;
  proto3_arena_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_3e8);
  local_c0[1].tagged_ptr_.ptr_._0_4_ = 0x70;
  pAVar2 = (Arena *)local_3e8._8_8_;
  if ((local_3e8._8_8_ & 1) != 0) {
    pAVar2 = *(Arena **)(local_3e8._8_8_ & 0xfffffffffffffffe);
  }
  local_c0[0].tagged_ptr_.ptr_ =
       (TaggedStringPtr)
       Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes_NestedMessage>(pAVar2);
  (((TestAllTypes_NestedMessage *)local_c0[0].tagged_ptr_.ptr_)->field_0)._impl_.bb_ = 0x32;
  *(byte *)&((TestAllTypes_NestedMessage *)local_c0[0].tagged_ptr_.ptr_)->field_0 =
       *(byte *)&((TestAllTypes_NestedMessage *)local_c0[0].tagged_ptr_.ptr_)->field_0 | 1;
  if (local_c0[1].tagged_ptr_.ptr_._0_4_ != 0x71) {
    proto3_arena_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)local_3e8);
    local_c0[1].tagged_ptr_.ptr_._0_4_ = 0x71;
    local_c0[0].tagged_ptr_.ptr_ = (TaggedStringPtr)&protobuf::internal::fixed_address_empty_string;
  }
  if ((local_3e8._8_8_ & 1) != 0) {
    local_3e8._8_8_ = *(undefined8 *)(local_3e8._8_8_ & 0xfffffffffffffffe);
  }
  value_01._M_str = "test";
  value_01._M_len = 4;
  protobuf::internal::ArenaStringPtr::Set(local_c0,value_01,(Arena *)local_3e8._8_8_);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b0);
  m = (TestAllTypes *)
      Arena::DefaultConstruct<proto3_arena_unittest::TestAllTypes>((Arena *)&local_b0);
  MessageLite::SerializeAsString_abi_cxx11_(&local_408,(MessageLite *)local_3e8);
  data._M_str = local_408._M_dataplus._M_p;
  data._M_len = local_408._M_string_length;
  MessageLite::ParseFromString((MessageLite *)m,data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  ExpectAllFieldsSet(m);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b0);
  proto3_arena_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_3e8);
  return;
}

Assistant:

TEST(Proto3ArenaLiteTest, Parsing) {
  TestAllTypes original;
  SetAllFields(&original);

  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->ParseFromString(original.SerializeAsString());
  ExpectAllFieldsSet(*arena_message);
}